

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::StddevState,double,duckdb::StandardErrorOfTheMeanOperation>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  double dVar1;
  unsigned_long *puVar2;
  double *idata;
  StddevState **states_00;
  sel_t *psVar3;
  sel_t *psVar4;
  long *plVar5;
  idx_t iVar6;
  idx_t iVar7;
  idx_t iVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  AggregateUnaryInput input_data;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_b8;
  UnifiedVectorFormat local_70;
  
  if ((input->vector_type == CONSTANT_VECTOR) && (states->vector_type == CONSTANT_VECTOR)) {
    puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) {
      local_b8.data = (data_ptr_t)&input->validity;
      local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)0x0;
      local_b8.sel = (SelectionVector *)aggr_input_data;
      STDDevBaseOperation::
      ConstantOperation<double,duckdb::StddevState,duckdb::StandardErrorOfTheMeanOperation>
                (*(StddevState **)states->data,(double *)input->data,
                 (AggregateUnaryInput *)&local_b8,count);
    }
  }
  else {
    if (input->vector_type == FLAT_VECTOR && states->vector_type == FLAT_VECTOR) {
      idata = (double *)input->data;
      states_00 = (StddevState **)states->data;
      FlatVector::VerifyFlatVector(input);
      UnaryFlatLoop<duckdb::StddevState,double,duckdb::StandardErrorOfTheMeanOperation>
                (idata,aggr_input_data,states_00,&input->validity,count);
      return;
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&local_b8);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_70);
    Vector::ToUnifiedFormat(input,count,&local_b8);
    Vector::ToUnifiedFormat(states,count,&local_70);
    if (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar3 = (local_b8.sel)->sel_vector;
        psVar4 = (local_70.sel)->sel_vector;
        iVar6 = 0;
        do {
          iVar7 = iVar6;
          if (psVar3 != (sel_t *)0x0) {
            iVar7 = (idx_t)psVar3[iVar6];
          }
          iVar8 = iVar6;
          if (psVar4 != (sel_t *)0x0) {
            iVar8 = (idx_t)psVar4[iVar6];
          }
          plVar5 = *(long **)(local_70.data + iVar8 * 8);
          lVar9 = *plVar5 + 1;
          *plVar5 = lVar9;
          dVar1 = *(double *)(local_b8.data + iVar7 * 8);
          dVar10 = dVar1 - (double)plVar5[1];
          auVar13._8_4_ = (int)((ulong)lVar9 >> 0x20);
          auVar13._0_8_ = lVar9;
          auVar13._12_4_ = 0x45300000;
          dVar11 = dVar10 / ((auVar13._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) +
                   (double)plVar5[1];
          plVar5[1] = (long)dVar11;
          plVar5[2] = (long)((dVar1 - dVar11) * dVar10 + (double)plVar5[2]);
          iVar6 = iVar6 + 1;
        } while (count != iVar6);
      }
    }
    else if (count != 0) {
      psVar3 = (local_b8.sel)->sel_vector;
      psVar4 = (local_70.sel)->sel_vector;
      iVar6 = 0;
      do {
        iVar7 = iVar6;
        if (psVar3 != (sel_t *)0x0) {
          iVar7 = (idx_t)psVar3[iVar6];
        }
        iVar8 = iVar6;
        if (psVar4 != (sel_t *)0x0) {
          iVar8 = (idx_t)psVar4[iVar6];
        }
        if ((local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar7 >> 6]
             >> (iVar7 & 0x3f) & 1) != 0) {
          plVar5 = *(long **)(local_70.data + iVar8 * 8);
          lVar9 = *plVar5 + 1;
          *plVar5 = lVar9;
          dVar1 = *(double *)(local_b8.data + iVar7 * 8);
          dVar10 = dVar1 - (double)plVar5[1];
          auVar12._8_4_ = (int)((ulong)lVar9 >> 0x20);
          auVar12._0_8_ = lVar9;
          auVar12._12_4_ = 0x45300000;
          dVar11 = dVar10 / ((auVar12._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) +
                   (double)plVar5[1];
          plVar5[1] = (long)dVar11;
          plVar5[2] = (long)((dVar1 - dVar11) * dVar10 + (double)plVar5[2]);
        }
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
    }
    if (local_70.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_b8.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}